

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# econ.cpp
# Opt level: O0

void __thiscall CEcon::Update(CEcon *this)

{
  bool bVar1;
  int iVar2;
  IConsole *pIVar3;
  NETADDR_conflict *pNVar4;
  int64 iVar5;
  long lVar6;
  int64 iVar7;
  CEcon *in_RDI;
  long in_FS_OFFSET;
  int i;
  int ClientID;
  char aFormatted [256];
  char aMsg [128];
  char aAddrStr [48];
  char aBuf [1400];
  char *in_stack_fffffffffffff888;
  CNetConsole *in_stack_fffffffffffff890;
  char *pReason;
  CNetConsole *in_stack_fffffffffffff898;
  CNetBan *in_stack_fffffffffffff8a0;
  int local_74c;
  CEcon *pCVar8;
  undefined4 in_stack_fffffffffffff8c0;
  uint in_stack_fffffffffffff8c4;
  NETADDR *in_stack_fffffffffffff8c8;
  char local_638 [128];
  undefined1 local_5b8 [48];
  char local_588 [1408];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar8 = in_RDI;
  if (((in_RDI->m_Ready & 1U) != 0) ||
     (bVar1 = Open((CEcon *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0)), bVar1))
  {
    CNetConsole::Update((CNetConsole *)in_RDI);
    while (iVar2 = CNetConsole::Recv((CNetConsole *)in_RDI,(char *)in_stack_fffffffffffff8a0,
                                     (int)((ulong)in_stack_fffffffffffff898 >> 0x20),
                                     (int *)in_stack_fffffffffffff890), iVar2 != 0) {
      dbg_assert_imp((char *)in_stack_fffffffffffff890,
                     (int)((ulong)in_stack_fffffffffffff888 >> 0x20),(int)in_stack_fffffffffffff888,
                     (char *)0x14b342);
      if (in_RDI->m_aClients[(int)in_stack_fffffffffffff8c4].m_State == 1) {
        iVar2 = str_comp((char *)in_stack_fffffffffffff890,in_stack_fffffffffffff888);
        if (iVar2 == 0) {
          in_RDI->m_aClients[(int)in_stack_fffffffffffff8c4].m_State = 2;
          CNetConsole::Send(in_stack_fffffffffffff898,
                            (int)((ulong)in_stack_fffffffffffff890 >> 0x20),
                            in_stack_fffffffffffff888);
          CNetConsole::ClientAddr
                    (in_stack_fffffffffffff890,(int)((ulong)in_stack_fffffffffffff888 >> 0x20));
          net_addr_str(in_stack_fffffffffffff8c8,
                       (char *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),
                       (int)((ulong)pCVar8 >> 0x20),(int)pCVar8);
          str_format(local_588,0x578,"cid=%d addr=%s  authed",(ulong)in_stack_fffffffffffff8c4,
                     local_5b8);
          pIVar3 = Console(in_RDI);
          (*(pIVar3->super_IInterface)._vptr_IInterface[0x19])(pIVar3,0,"econ",local_588);
        }
        else {
          in_RDI->m_aClients[(int)in_stack_fffffffffffff8c4].m_AuthTries =
               in_RDI->m_aClients[(int)in_stack_fffffffffffff8c4].m_AuthTries + 1;
          str_format(local_638,0x80,"Wrong password %d/%d.",
                     (ulong)(uint)in_RDI->m_aClients[(int)in_stack_fffffffffffff8c4].m_AuthTries,3);
          CNetConsole::Send(in_stack_fffffffffffff898,
                            (int)((ulong)in_stack_fffffffffffff890 >> 0x20),
                            in_stack_fffffffffffff888);
          if (2 < in_RDI->m_aClients[(int)in_stack_fffffffffffff8c4].m_AuthTries) {
            if (in_RDI->m_pConfig->m_EcBantime != 0) {
              in_stack_fffffffffffff8a0 = CNetConsole::NetBan(&in_RDI->m_NetConsole);
              pNVar4 = CNetConsole::ClientAddr
                                 (in_stack_fffffffffffff890,
                                  (int)((ulong)in_stack_fffffffffffff888 >> 0x20));
              (*in_stack_fffffffffffff8a0->_vptr_CNetBan[2])
                        (in_stack_fffffffffffff8a0,pNVar4,
                         (ulong)(uint)(in_RDI->m_pConfig->m_EcBantime * 0x3c),
                         "Too many authentication tries");
            }
            CNetConsole::Drop((CNetConsole *)in_stack_fffffffffffff8a0,
                              (int)((ulong)in_stack_fffffffffffff898 >> 0x20),
                              (char *)in_stack_fffffffffffff890);
          }
        }
      }
      else if (in_RDI->m_aClients[(int)in_stack_fffffffffffff8c4].m_State == 2) {
        str_format(&stack0xfffffffffffff8c8,0x100,"cid=%d cmd=\'%s\'",
                   (ulong)in_stack_fffffffffffff8c4,local_588);
        pIVar3 = Console(in_RDI);
        (*(pIVar3->super_IInterface)._vptr_IInterface[0x19])
                  (pIVar3,1,"server",&stack0xfffffffffffff8c8,0);
        in_RDI->m_UserClientID = in_stack_fffffffffffff8c4;
        pIVar3 = Console(in_RDI);
        (*(pIVar3->super_IInterface)._vptr_IInterface[0x13])(pIVar3,local_588);
        in_RDI->m_UserClientID = -1;
      }
    }
    for (local_74c = 0; local_74c < 4; local_74c = local_74c + 1) {
      if (in_RDI->m_aClients[local_74c].m_State == 1) {
        iVar5 = time_get();
        pReason = (char *)in_RDI->m_aClients[local_74c].m_TimeConnected;
        lVar6 = (long)in_RDI->m_pConfig->m_EcAuthTimeout;
        iVar7 = time_freq();
        if ((long)(pReason + lVar6 * iVar7) < iVar5) {
          CNetConsole::Drop((CNetConsole *)in_stack_fffffffffffff8a0,(int)((ulong)iVar5 >> 0x20),
                            pReason);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CEcon::Update()
{
	if(!m_Ready && !Open())
		return;	

	m_NetConsole.Update();

	char aBuf[NET_MAX_PACKETSIZE];
	int ClientID;

	while(m_NetConsole.Recv(aBuf, (int)(sizeof(aBuf))-1, &ClientID))
	{
		dbg_assert(m_aClients[ClientID].m_State != CClient::STATE_EMPTY, "got message from empty slot");
		if(m_aClients[ClientID].m_State == CClient::STATE_CONNECTED)
		{
			if(str_comp(aBuf, m_pConfig->m_EcPassword) == 0)
			{
				m_aClients[ClientID].m_State = CClient::STATE_AUTHED;
				m_NetConsole.Send(ClientID, "Authentication successful. External console access granted.");

				char aAddrStr[NETADDR_MAXSTRSIZE];
				net_addr_str(m_NetConsole.ClientAddr(ClientID), aAddrStr, sizeof(aAddrStr), true);
				str_format(aBuf, sizeof(aBuf), "cid=%d addr=%s  authed", ClientID, aAddrStr);
				Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "econ", aBuf);
			}
			else
			{
				m_aClients[ClientID].m_AuthTries++;
				char aMsg[128];
				str_format(aMsg, sizeof(aMsg), "Wrong password %d/%d.", m_aClients[ClientID].m_AuthTries, MAX_AUTH_TRIES);
				m_NetConsole.Send(ClientID, aMsg);
				if(m_aClients[ClientID].m_AuthTries >= MAX_AUTH_TRIES)
				{
					if(m_pConfig->m_EcBantime)
						m_NetConsole.NetBan()->BanAddr(m_NetConsole.ClientAddr(ClientID), m_pConfig->m_EcBantime*60, "Too many authentication tries");
					m_NetConsole.Drop(ClientID, "Too many authentication tries");
				}
			}
		}
		else if(m_aClients[ClientID].m_State == CClient::STATE_AUTHED)
		{
			char aFormatted[256];
			str_format(aFormatted, sizeof(aFormatted), "cid=%d cmd='%s'", ClientID, aBuf);
			Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "server", aFormatted);
			m_UserClientID = ClientID;
			Console()->ExecuteLine(aBuf);
			m_UserClientID = -1;
		}
	}

	for(int i = 0; i < NET_MAX_CONSOLE_CLIENTS; ++i)
	{
		if(m_aClients[i].m_State == CClient::STATE_CONNECTED &&
			time_get() > m_aClients[i].m_TimeConnected + m_pConfig->m_EcAuthTimeout * time_freq())
			m_NetConsole.Drop(i, "authentication timeout");
	}
}